

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

void __thiscall QPDFParser::warn(QPDFParser *this,QPDFExc *e)

{
  QPDFExc *this_00;
  QPDFExc *e_local;
  QPDFParser *this_local;
  
  if (this->context != (QPDF *)0x0) {
    QPDF::warn(this->context,e);
    return;
  }
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  QPDFExc::QPDFExc(this_00,e);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDFParser::warn(QPDFExc const& e) const
{
    // If parsing on behalf of a QPDF object and want to give a warning, we can warn through the
    // object. If parsing for some other reason, such as an explicit creation of an object from a
    // string, then just throw the exception.
    if (context) {
        context->warn(e);
    } else {
        throw e;
    }
}